

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_x86_movImmediate32
               (sysbvm_bytecodeJit_t *jit,sysbvm_x86_register_t destination,int32_t value)

{
  uint8_t local_1f [3];
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  int32_t iStack_18;
  uint8_t instruction [7];
  int32_t value_local;
  sysbvm_x86_register_t destination_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  iStack_18 = value;
  instruction._3_4_ = destination;
  local_1f[0] = sysbvm_jit_x86_rex(true,false,false,SYSBVM_X86_64_ARG0 < destination);
  local_1f[1] = 199;
  local_1f[2] = sysbvm_jit_x86_modRMRegister(instruction._3_4_,SYSBVM_X86_64_CALL_SHADOW_SPACE);
  local_1c = (undefined1)iStack_18;
  local_1b = SUB41(iStack_18,1);
  local_1a = SUB41(iStack_18,2);
  local_19 = SUB41(iStack_18,3);
  sysbvm_bytecodeJit_addBytes(jit,7,local_1f);
  return;
}

Assistant:

static void sysbvm_jit_x86_movImmediate32(sysbvm_bytecodeJit_t *jit, sysbvm_x86_register_t destination, int32_t value)
{
    uint8_t instruction[] = {
        sysbvm_jit_x86_rex(true, false, false, destination > SYSBVM_X86_REG_HALF_MASK),
        0xC7,
        sysbvm_jit_x86_modRMRegister(destination, 0),
        value & 0xFF, (value >> 8) & 0xFF, (value >> 16) & 0xFF, (value >> 24) & 0xFF,
    };

    sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
}